

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

long cs_impl::to_integer<std::__cxx11::string>(string *str)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  long lVar3;
  char *ch;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_49;
  string local_48 [32];
  reference local_28;
  undefined8 local_20;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18 [3];
  
  local_18[0]._M_current = (char *)std::__cxx11::string::begin();
  local_20 = std::__cxx11::string::end();
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff90,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      lVar3 = std::__cxx11::stol(in_stack_ffffffffffffff90,(size_t *)in_stack_ffffffffffffff88,0);
      return lVar3;
    }
    local_28 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(local_18);
    iVar2 = isdigit((int)*local_28);
    if (iVar2 == 0) break;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(local_18);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Wrong literal format.",&local_49);
  cs::runtime_error::runtime_error(this,in_stack_ffffffffffffff88);
  __cxa_throw(this,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

long to_integer<std::string>(const std::string &str)
	{
		for (auto &ch: str) {
			if (!std::isdigit(ch))
				throw cs::runtime_error("Wrong literal format.");
		}
		return std::stol(str);
	}